

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
::initEmpty(DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
            *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  *(undefined8 *)(this + 8) = 0;
  auVar3 = _DAT_00dcd9d0;
  auVar2 = _DAT_00dcd9c0;
  uVar1 = *(uint *)(this + 0x10);
  if ((uVar1 & uVar1 - 1) == 0) {
    if ((ulong)uVar1 != 0) {
      uVar5 = (ulong)uVar1 + 0xfffffffffffffff;
      uVar6 = uVar5 & 0xfffffffffffffff;
      auVar8._8_4_ = (int)uVar6;
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = (int)(uVar6 >> 0x20);
      puVar4 = (undefined8 *)(*(long *)this + 0x10);
      lVar7 = 0;
      auVar8 = auVar8 ^ _DAT_00dcd9d0;
      do {
        auVar9._8_4_ = (int)lVar7;
        auVar9._0_8_ = lVar7;
        auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar9 = (auVar9 | auVar2) ^ auVar3;
        if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                    auVar8._4_4_ < auVar9._4_4_) & 1)) {
          puVar4[-2] = 0xffffffffffffffff;
        }
        if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
            auVar9._12_4_ <= auVar8._12_4_) {
          *puVar4 = 0xffffffffffffffff;
        }
        lVar7 = lVar7 + 2;
        puVar4 = puVar4 + 4;
      } while ((uVar6 - ((uint)uVar5 & 1)) + 2 != lVar7);
    }
    return;
  }
  __assert_fail("(getNumBuckets() & (getNumBuckets()-1)) == 0 && \"# initial buckets must be a power of two!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x15c,
                "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, unsigned long, const llvm::DWARFDebugNames::NameIndex *, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>>::initEmpty() [DerivedT = llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, KeyT = unsigned long, ValueT = const llvm::DWARFDebugNames::NameIndex *, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>]"
               );
}

Assistant:

void initEmpty() {
    setNumEntries(0);
    setNumTombstones(0);

    assert((getNumBuckets() & (getNumBuckets()-1)) == 0 &&
           "# initial buckets must be a power of two!");
    const KeyT EmptyKey = getEmptyKey();
    for (BucketT *B = getBuckets(), *E = getBucketsEnd(); B != E; ++B)
      ::new (&B->getFirst()) KeyT(EmptyKey);
  }